

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_main.c
# Opt level: O0

int cmdUsage(void)

{
  char *pcVar1;
  size_t sVar2;
  size_t pos;
  ulong local_8;
  
  printf("Usage:\n  bee2cmd {");
  for (local_8 = 0; local_8 + 1 < _count; local_8 = local_8 + 1) {
    printf("%s|",_cmds[local_8].name);
  }
  printf("%s} ...\n",_cmds[local_8].name);
  for (local_8 = 0; local_8 < _count; local_8 = local_8 + 1) {
    pcVar1 = _cmds[local_8].name;
    sVar2 = strLen((char *)0x115be6);
    printf("    %s%*s%s\n",pcVar1,(ulong)(0xc - (int)sVar2),"",_cmds[local_8].descr);
  }
  return -1;
}

Assistant:

int cmdUsage()
{
	size_t pos;
	// перечень команд
	printf(
		"Usage:\n"
		"  bee2cmd {");
	for (pos = 0; pos + 1 < _count; ++pos)
		printf("%s|", _cmds[pos].name);
	printf("%s} ...\n", _cmds[pos].name);
	// краткая справка по каждой команде
	for (pos = 0; pos < _count; ++pos)
		printf("    %s%*s%s\n",
			_cmds[pos].name,
			(int)(12 - strLen(_cmds[pos].name)), "",
			_cmds[pos].descr);
	return -1;
}